

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

session_params * __thiscall
libtorrent::aux::session_impl::session_state
          (session_params *__return_storage_ptr__,session_impl *this,save_state_flags_t flags)

{
  dht_tracker *this_00;
  pointer ppVar1;
  pointer ppVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer psVar5;
  ip_filter *piVar6;
  mapped_type *this_01;
  pointer ppVar7;
  pointer psVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state;
  undefined1 local_88 [16];
  pointer local_78;
  pointer ppStack_70;
  _Base_ptr local_68;
  pointer ppStack_60;
  pointer local_58;
  pointer ppStack_50;
  pointer local_48;
  pointer local_40;
  session_impl *local_38;
  
  session_params::session_params(__return_storage_ptr__);
  if ((flags.m_val & 1) != 0) {
    non_default_settings((settings_pack *)local_88,&this->m_settings);
    settings_pack::operator=
              (&__return_storage_ptr__->settings,
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
               local_88);
    if (ppStack_50 != (pointer)0x0) {
      operator_delete(ppStack_50,(long)local_40 - (long)ppStack_50);
    }
    if (local_68 != (_Base_ptr)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    ::std::
    vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_88 + 8));
  }
  if ((flags.m_val & 2) != 0) {
    get_dht_settings((dht_settings *)local_88,this);
    *(pointer *)&(__return_storage_ptr__->dht_settings).item_lifetime = local_58;
    *(pointer *)&(__return_storage_ptr__->dht_settings).sample_infohashes_interval = ppStack_50;
    *(_Base_ptr *)&(__return_storage_ptr__->dht_settings).privacy_lookups = local_68;
    *(pointer *)&(__return_storage_ptr__->dht_settings).block_ratelimit = ppStack_60;
    *(pointer *)&(__return_storage_ptr__->dht_settings).max_dht_items = local_78;
    *(pointer *)&(__return_storage_ptr__->dht_settings).max_torrent_search_reply = ppStack_70;
    (__return_storage_ptr__->dht_settings).max_peers_reply = local_88._0_4_;
    (__return_storage_ptr__->dht_settings).search_branching = local_88._4_4_;
    (__return_storage_ptr__->dht_settings).max_fail_count = local_88._8_4_;
    (__return_storage_ptr__->dht_settings).max_torrents = local_88._12_4_;
  }
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((byte)((flags.m_val & 4) >> 2) & this_00 != (dht_tracker *)0x0) == 1) {
    libtorrent::dht::dht_tracker::state((dht_state *)local_88,this_00);
    ppVar1 = (__return_storage_ptr__->dht_state).nids.
             super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (__return_storage_ptr__->dht_state).nids.
             super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->dht_state).nids.
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (__return_storage_ptr__->dht_state).nids.
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (__return_storage_ptr__->dht_state).nids.
    super__Vector_base<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>,_std::allocator<std::pair<boost::asio::ip::address,_libtorrent::digest32<160L>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_78 = (pointer)0x0;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1,(long)ppVar2 - (long)ppVar1);
    }
    pbVar3 = (__return_storage_ptr__->dht_state).nodes.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (__return_storage_ptr__->dht_state).nodes.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->dht_state).nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppStack_70;
    (__return_storage_ptr__->dht_state).nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_68;
    (__return_storage_ptr__->dht_state).nodes.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ppStack_60;
    ppStack_70 = (pointer)0x0;
    local_68 = (_Base_ptr)0x0;
    ppStack_60 = (pointer)0x0;
    if (pbVar3 != (pointer)0x0) {
      operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3);
    }
    pbVar3 = (__return_storage_ptr__->dht_state).nodes6.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (__return_storage_ptr__->dht_state).nodes6.
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->dht_state).nodes6.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_58;
    (__return_storage_ptr__->dht_state).nodes6.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)ppStack_50;
    (__return_storage_ptr__->dht_state).nodes6.
    super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_48;
    local_58 = (pointer)0x0;
    ppStack_50 = (pointer)0x0;
    local_48 = (pointer)0x0;
    if ((pbVar3 != (pointer)0x0) &&
       (operator_delete(pbVar3,(long)pbVar4 - (long)pbVar3), local_58 != (pointer)0x0)) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
    if (ppStack_70 != (pointer)0x0) {
      operator_delete(ppStack_70,(long)ppStack_60 - (long)ppStack_70);
    }
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
    }
  }
  local_38 = this;
  if ((flags.m_val >> 0xb & 1) != 0) {
    psVar8 = (this->m_ses_extensions)._M_elems[0].
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (this->m_ses_extensions)._M_elems[0].
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar8 != psVar5) {
      do {
        (*((psVar8->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          _vptr_plugin[0xd])
                  ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_88);
        for (ppVar7 = ppStack_70; ppVar7 != (pointer)(local_88 + 8);
            ppVar7 = (pointer)::std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar7)) {
          this_01 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&__return_storage_ptr__->ext_state,
                                 (key_type *)((long)&(ppVar7->second).field_2 + 8));
          ::std::__cxx11::string::operator=
                    ((string *)this_01,(string *)ppVar7[1].second.field_2._M_local_buf);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_88);
        psVar8 = psVar8 + 1;
      } while (psVar8 != psVar5);
    }
  }
  if (((flags.m_val >> 0xc & 1) != 0) &&
     (piVar6 = (local_38->m_ip_filter).
               super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     piVar6 != (ip_filter *)0x0)) {
    ip_filter::operator=(&__return_storage_ptr__->ip_filter,piVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params session_impl::session_state(save_state_flags_t const flags) const
	{
		TORRENT_ASSERT(is_single_thread());

		session_params ret;
		if (flags & session::save_settings)
			ret.settings = non_default_settings(m_settings);

#ifndef TORRENT_DISABLE_DHT
#if TORRENT_ABI_VERSION <= 2
	if (flags & session_handle::save_dht_settings)
	{
		ret.dht_settings = get_dht_settings();
	}
#endif

		if (m_dht && (flags & session::save_dht_state))
			ret.dht_state = m_dht->state();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		if (flags & session::save_extension_state)
		{
			for (auto const& ext : m_ses_extensions[plugins_all_idx])
			{
				auto state = ext->save_state();
				for (auto& v : state)
					ret.ext_state[std::move(v.first)] = std::move(v.second);
			}
		}
#endif

		if ((flags & session::save_ip_filter) && m_ip_filter)
		{
			ret.ip_filter = *m_ip_filter;
		}
		return ret;
	}